

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMotorLinearDriveline.cpp
# Opt level: O2

void __thiscall
chrono::ChLinkMotorLinearDriveline::Update
          (ChLinkMotorLinearDriveline *this,double mytime,bool update_assets)

{
  ChFrame<double> *pCVar1;
  element_type *peVar2;
  ChVector<double> shaftdir_b2rot;
  ChVector<double> shaftdir_b2;
  ChVector<double> shaftpos_b2;
  ChVector<double> shaftpos_b1;
  ChVector<double> shaftdir_b1;
  ChVector<double> abs_shaft2_rotation_dir;
  ChVector<double> abs_shaftdir;
  ChVector<double> local_178;
  ChQuaternion<double> local_160;
  ChVector<double> local_138;
  ChVector<double> local_118;
  ChVector<double> local_f8;
  ChVector<double> local_d8;
  ChVector<double> local_b8;
  ChVector<double> local_98;
  ChVector<double> local_78;
  ChVector<double> local_60;
  ChVector<double> local_48;
  
  ChLinkMotorLinear::Update(&this->super_ChLinkMotorLinear,mytime,update_assets);
  (**(code **)(*(long *)&(this->super_ChLinkMotorLinear).super_ChLinkMotor.super_ChLinkMateGeneric.
                         super_ChLinkMate.super_ChLink.super_ChLinkBase.super_ChPhysicsItem + 0x1f8)
  )(&local_178,this);
  ChQuaternion<double>::Rotate(&local_160,(ChVector<double> *)&VECT_X);
  ChFrame<double>::TransformDirectionParentToLocal
            (&local_78,
             (ChFrame<double> *)
             (this->super_ChLinkMotorLinear).super_ChLinkMotor.super_ChLinkMateGeneric.
             super_ChLinkMate.super_ChLink.Body1,&local_48);
  ChFrame<double>::TransformDirectionParentToLocal
            (&local_138,
             (ChFrame<double> *)
             (this->super_ChLinkMotorLinear).super_ChLinkMotor.super_ChLinkMateGeneric.
             super_ChLinkMate.super_ChLink.Body2,&local_48);
  pCVar1 = (ChFrame<double> *)
           (this->super_ChLinkMotorLinear).super_ChLinkMotor.super_ChLinkMateGeneric.
           super_ChLinkMate.super_ChLink.Body1;
  (**(code **)(*(long *)&(this->super_ChLinkMotorLinear).super_ChLinkMotor.super_ChLinkMateGeneric.
                         super_ChLinkMate.super_ChLink.super_ChLinkBase.super_ChPhysicsItem + 0x1f8)
  )(&local_178,this);
  ChFrame<double>::TransformPointParentToLocal(&local_98,pCVar1,&local_178);
  pCVar1 = (ChFrame<double> *)
           (this->super_ChLinkMotorLinear).super_ChLinkMotor.super_ChLinkMateGeneric.
           super_ChLinkMate.super_ChLink.Body2;
  (**(code **)(*(long *)&(this->super_ChLinkMotorLinear).super_ChLinkMotor.super_ChLinkMateGeneric.
                         super_ChLinkMate.super_ChLink.super_ChLinkBase.super_ChPhysicsItem + 0x1f8)
  )(&local_178,this);
  ChFrame<double>::TransformPointParentToLocal(&local_b8,pCVar1,&local_178);
  (**(code **)(*(long *)&(this->super_ChLinkMotorLinear).super_ChLinkMotor.super_ChLinkMateGeneric.
                         super_ChLinkMate.super_ChLink.super_ChLinkBase.super_ChPhysicsItem + 0x1f8)
  )(&local_178,this);
  ChQuaternion<double>::Rotate(&local_160,&this->shaft2_rotation_dir);
  ChFrame<double>::TransformDirectionParentToLocal
            (&local_178,
             (ChFrame<double> *)
             (this->super_ChLinkMotorLinear).super_ChLinkMotor.super_ChLinkMateGeneric.
             super_ChLinkMate.super_ChLink.Body2,&local_60);
  local_d8.m_data[0] = local_78.m_data[0];
  local_d8.m_data[1] = local_78.m_data[1];
  local_d8.m_data[2] = local_78.m_data[2];
  ChShaftsBodyTranslation::SetShaftDirection
            ((this->innerconstraint1lin).
             super___shared_ptr<chrono::ChShaftsBodyTranslation,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             &local_d8);
  peVar2 = (this->innerconstraint1lin).
           super___shared_ptr<chrono::ChShaftsBodyTranslation,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (peVar2->shaft_pos).m_data[0] = local_98.m_data[0];
  (peVar2->shaft_pos).m_data[1] = local_98.m_data[1];
  (peVar2->shaft_pos).m_data[2] = local_98.m_data[2];
  local_f8.m_data[0] = local_138.m_data[0];
  local_f8.m_data[1] = local_138.m_data[1];
  local_f8.m_data[2] = local_138.m_data[2];
  ChShaftsBodyTranslation::SetShaftDirection
            ((this->innerconstraint2lin).
             super___shared_ptr<chrono::ChShaftsBodyTranslation,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             &local_f8);
  peVar2 = (this->innerconstraint2lin).
           super___shared_ptr<chrono::ChShaftsBodyTranslation,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (peVar2->shaft_pos).m_data[0] = local_b8.m_data[0];
  (peVar2->shaft_pos).m_data[1] = local_b8.m_data[1];
  (peVar2->shaft_pos).m_data[2] = local_b8.m_data[2];
  local_118.m_data[0] = local_178.m_data[0];
  local_118.m_data[1] = local_178.m_data[1];
  local_118.m_data[2] = local_178.m_data[2];
  ChShaftsBody::SetShaftDirection
            ((this->innerconstraint2rot).
             super___shared_ptr<chrono::ChShaftsBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr,&local_118)
  ;
  return;
}

Assistant:

void ChLinkMotorLinearDriveline::Update(double mytime, bool update_assets) {
    // Inherit parent class:
    ChLinkMotorLinear::Update(mytime, update_assets);

    // Update the direction of 1D-3D ChShaftBody constraints:
    ChVector<> abs_shaftdir = this->GetLinkAbsoluteCoords().TransformDirectionLocalToParent(VECT_X);
    ChVector<> shaftdir_b1 = this->Body1->TransformDirectionParentToLocal(abs_shaftdir);
    ChVector<> shaftdir_b2 = this->Body2->TransformDirectionParentToLocal(abs_shaftdir);
    ChVector<> shaftpos_b1 = this->Body1->TransformPointParentToLocal(this->GetLinkAbsoluteCoords().pos);
    ChVector<> shaftpos_b2 = this->Body2->TransformPointParentToLocal(this->GetLinkAbsoluteCoords().pos);
    ChVector<> abs_shaft2_rotation_dir =
        this->GetLinkAbsoluteCoords().TransformDirectionLocalToParent(this->shaft2_rotation_dir);
    ChVector<> shaftdir_b2rot = this->Body2->TransformDirectionParentToLocal(abs_shaft2_rotation_dir);

    innerconstraint1lin->SetShaftDirection(shaftdir_b1);
    innerconstraint1lin->SetShaftPos(shaftpos_b1);

    innerconstraint2lin->SetShaftDirection(shaftdir_b2);
    innerconstraint2lin->SetShaftPos(shaftpos_b2);

    innerconstraint2rot->SetShaftDirection(shaftdir_b2rot);
}